

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClauseVariantIndex.cpp
# Opt level: O3

ClauseIterator __thiscall
Indexing::SubstitutionTreeClauseVariantIndex::retrieveVariants
          (SubstitutionTreeClauseVariantIndex *this,Literal **lits,uint length)

{
  undefined8 uVar1;
  int iVar2;
  Entry *pEVar3;
  _func_int **pp_Var4;
  Literal *pLVar5;
  uint in_ECX;
  uint uVar6;
  Literal *pLVar7;
  undefined4 in_register_00000014;
  Literal **key;
  List<Kernel::Clause_*> *pLVar8;
  SubstitutionTreeClauseVariantIndex *this_00;
  bool bVar9;
  bool bVar10;
  undefined1 local_148 [16];
  undefined1 local_138 [24];
  LiteralMiniIndex *local_120;
  LiteralMiniIndex *local_118;
  _func_int **local_110;
  VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>
  local_108;
  bool local_100;
  ResultClauseToVariantClauseFn local_f0;
  ResultClauseToVariantClauseFn local_c8;
  ResultClauseToVariantClauseFn local_a8;
  _func_int **local_80;
  ResultClauseToVariantClauseFn local_70;
  _func_int **local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  key = (Literal **)CONCAT44(in_register_00000014,length);
  if (in_ECX == 1) {
    pLVar7 = *key;
    iVar2 = 0;
    if (*(int *)&(pLVar7->super_Term).field_0xc < 0) {
      iVar2 = 0;
      do {
        pLVar7 = *(Literal **)&(pLVar7->super_Term).field_9._vars;
        if (((ulong)pLVar7 & 1) != 0) {
          uVar6 = 3;
          goto LAB_002baf49;
        }
        iVar2 = iVar2 + 2;
      } while (*(int *)&(pLVar7->super_Term).field_0xc < 0);
    }
    uVar6 = (pLVar7->super_Term).field_9._vars;
LAB_002baf49:
    if (iVar2 + uVar6 == 0) {
      pEVar3 = Lib::
               DHMap<Kernel::Literal_*,_Lib::List<Kernel::Clause_*>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
               ::findEntry((DHMap<Kernel::Literal_*,_Lib::List<Kernel::Clause_*>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
                            *)(lits + 1),key);
      if (pEVar3 != (Entry *)0x0) {
        pLVar8 = pEVar3->_val;
        goto LAB_002baf69;
      }
      goto LAB_002bb050;
    }
  }
  else if (in_ECX == 0) {
    pLVar8 = (List<Kernel::Clause_*> *)lits[9];
LAB_002baf69:
    pp_Var4 = (_func_int **)
              Lib::FixedSizeAllocator<24UL>::alloc
                        ((FixedSizeAllocator<24UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30));
    *pp_Var4 = (_func_int *)&PTR__IteratorCore_00b27e38;
    pp_Var4[2] = (_func_int *)pLVar8;
    (this->super_ClauseVariantIndex)._vptr_ClauseVariantIndex = pp_Var4;
    *(undefined4 *)(pp_Var4 + 1) = 1;
    return (ClauseIterator)(IteratorCore<Kernel::Clause_*> *)this;
  }
  pLVar7 = (Literal *)(ulong)in_ECX;
  this_00 = this;
  if (lits[7] <= pLVar7) {
    this_00 = (SubstitutionTreeClauseVariantIndex *)(lits + 6);
    Lib::Array<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*>::expandToFit
              ((Array<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*> *)this_00,
               (size_t)pLVar7);
  }
  pLVar7 = (Literal *)
           (lits[8]->super_Term)._args[(long)((long)&pLVar7[-1].super_Term._args[0]._content + 3)].
           _content;
  if (pLVar7 != (Literal *)0x0) {
    local_148._8_8_ = this;
    pLVar5 = getMainLiteral(this_00,key,in_ECX);
    LiteralSubstitutionTree<Indexing::LiteralClause>::getVariants
              ((LiteralSubstitutionTree<Indexing::LiteralClause> *)local_148,pLVar7,SUB81(pLVar5,0),
               false);
    ClauseVariantIndex::ResultClauseToVariantClauseFn::ResultClauseToVariantClauseFn
              (&local_c8,key,in_ECX);
    local_138._0_8_ = local_c8._lits;
    local_138._16_8_ = local_c8._queryIndex._obj;
    local_120 = (LiteralMiniIndex *)local_c8._queryIndex._refCnt;
    bVar9 = local_c8._queryIndex._obj != (LiteralMiniIndex *)0x0;
    bVar10 = (LiteralMiniIndex *)local_c8._queryIndex._refCnt != (LiteralMiniIndex *)0x0;
    if (bVar10 && bVar9) {
      (local_c8._queryIndex._refCnt)->_val = (local_c8._queryIndex._refCnt)->_val + 2;
    }
    local_f0._length = local_c8._length;
    local_f0._lits = local_c8._lits;
    local_f0._queryIndex._obj = local_c8._queryIndex._obj;
    local_f0._queryIndex._refCnt = local_c8._queryIndex._refCnt;
    ClauseVariantIndex::ResultClauseToVariantClauseFn::~ResultClauseToVariantClauseFn
              ((ResultClauseToVariantClauseFn *)local_138);
    uVar1 = local_148._0_8_;
    if ((_func_int **)local_148._0_8_ != (_func_int **)0x0) {
      *(int *)(local_148._0_8_ + 8) = *(int *)(local_148._0_8_ + 8) + 1;
    }
    local_138._8_4_ = local_f0._length;
    local_138._0_8_ = local_f0._lits;
    local_138._16_8_ = local_c8._queryIndex._obj;
    local_120 = (LiteralMiniIndex *)local_c8._queryIndex._refCnt;
    if (bVar10 && bVar9) {
      (local_c8._queryIndex._refCnt)->_val = (local_c8._queryIndex._refCnt)->_val + 2;
    }
    local_a8._length = local_f0._length;
    local_a8._lits = local_f0._lits;
    local_a8._queryIndex._obj = local_c8._queryIndex._obj;
    local_a8._queryIndex._refCnt = local_c8._queryIndex._refCnt;
    local_80 = (_func_int **)local_148._0_8_;
    if ((_func_int **)local_148._0_8_ == (_func_int **)0x0) {
      ClauseVariantIndex::ResultClauseToVariantClauseFn::~ResultClauseToVariantClauseFn
                ((ResultClauseToVariantClauseFn *)local_138);
    }
    else {
      *(int *)(local_148._0_8_ + 8) = *(int *)(local_148._0_8_ + 8) + 1;
      ClauseVariantIndex::ResultClauseToVariantClauseFn::~ResultClauseToVariantClauseFn
                ((ResultClauseToVariantClauseFn *)local_138);
      pp_Var4 = (_func_int **)(uVar1 + 8);
      *(int *)pp_Var4 = *(int *)pp_Var4 + -1;
      if (*(int *)pp_Var4 == 0) {
        (**(code **)(*(_func_int **)uVar1 + 8))(uVar1);
      }
    }
    local_138._8_4_ = local_a8._length;
    local_138._0_8_ = local_a8._lits;
    local_138._16_8_ = local_c8._queryIndex._obj;
    local_120 = (LiteralMiniIndex *)local_c8._queryIndex._refCnt;
    if (bVar10 && bVar9) {
      (local_c8._queryIndex._refCnt)->_val = (local_c8._queryIndex._refCnt)->_val + 1;
    }
    local_110 = (_func_int **)uVar1;
    if ((_func_int **)uVar1 != (_func_int **)0x0) {
      *(int *)(uVar1 + 8) = *(int *)(uVar1 + 8) + 1;
    }
    local_70._length = local_a8._length;
    local_70._lits = local_a8._lits;
    local_70._queryIndex._obj = local_c8._queryIndex._obj;
    local_70._queryIndex._refCnt = local_c8._queryIndex._refCnt;
    if (bVar10 && bVar9) {
      (local_c8._queryIndex._refCnt)->_val = (local_c8._queryIndex._refCnt)->_val + 1;
    }
    local_48 = (_func_int **)uVar1;
    if ((_func_int **)uVar1 == (_func_int **)0x0) {
      local_40 = 0;
      uStack_38 = 0;
    }
    else {
      local_40 = 0;
      uStack_38 = 0;
      if (*(int *)(uVar1 + 8) == 0) {
        (**(code **)(*(_func_int **)uVar1 + 8))(uVar1);
      }
    }
    ClauseVariantIndex::ResultClauseToVariantClauseFn::~ResultClauseToVariantClauseFn
              ((ResultClauseToVariantClauseFn *)local_138);
    pp_Var4 = (_func_int **)::operator_new(0x58,8);
    local_138._16_4_ = local_70._length;
    local_138._8_8_ = local_70._lits;
    local_120 = local_c8._queryIndex._obj;
    local_118 = (LiteralMiniIndex *)local_c8._queryIndex._refCnt;
    if (bVar10 && bVar9) {
      (local_c8._queryIndex._refCnt)->_val = (local_c8._queryIndex._refCnt)->_val + 1;
    }
    local_108._core =
         (IteratorCore<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>
          *)uVar1;
    if ((_func_int **)uVar1 != (_func_int **)0x0) {
      *(int *)(uVar1 + 8) = *(int *)(uVar1 + 8) + 1;
    }
    local_100 = false;
    *(undefined4 *)(pp_Var4 + 1) = 0;
    *pp_Var4 = (_func_int *)&PTR__ProxyIterator_00b281a8;
    Lib::
    FilteredIterator<Lib::MappingIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>,_Lib::CompositionFn<Indexing::ClauseVariantIndex::ResultClauseToVariantClauseFn,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Indexing/ClauseVariantIndex.cpp:132:68)>,_Kernel::Clause_*>,_Lib::NonzeroFn,_false>
    ::FilteredIterator((FilteredIterator<Lib::MappingIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>,_Lib::CompositionFn<Indexing::ClauseVariantIndex::ResultClauseToVariantClauseFn,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_ClauseVariantIndex_cpp:132:68)>,_Kernel::Clause_*>,_Lib::NonzeroFn,_false>
                        *)(pp_Var4 + 2),
                       (FilteredIterator<Lib::MappingIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>,_Lib::CompositionFn<Indexing::ClauseVariantIndex::ResultClauseToVariantClauseFn,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_ClauseVariantIndex_cpp:132:68)>,_Kernel::Clause_*>,_Lib::NonzeroFn,_false>
                        *)local_138);
    ((ClauseVariantIndex *)local_148._8_8_)->_vptr_ClauseVariantIndex = pp_Var4;
    *(int *)(pp_Var4 + 1) = *(int *)(pp_Var4 + 1) + 1;
    if ((_func_int **)uVar1 != (_func_int **)0x0) {
      pp_Var4 = (_func_int **)(uVar1 + 8);
      *(int *)pp_Var4 = *(int *)pp_Var4 + -1;
      if (*(int *)pp_Var4 == 0) {
        (**(code **)(*(_func_int **)uVar1 + 8))(uVar1);
      }
    }
    ClauseVariantIndex::ResultClauseToVariantClauseFn::~ResultClauseToVariantClauseFn
              ((ResultClauseToVariantClauseFn *)(local_138 + 8));
    if (local_48 != (_func_int **)0x0) {
      pp_Var4 = local_48 + 1;
      *(int *)pp_Var4 = *(int *)pp_Var4 + -1;
      if (*(int *)pp_Var4 == 0) {
        (**(code **)(*local_48 + 8))();
      }
    }
    ClauseVariantIndex::ResultClauseToVariantClauseFn::~ResultClauseToVariantClauseFn(&local_70);
    uVar1 = local_148._8_8_;
    if (local_80 != (_func_int **)0x0) {
      pp_Var4 = local_80 + 1;
      *(int *)pp_Var4 = *(int *)pp_Var4 + -1;
      if (*(int *)pp_Var4 == 0) {
        (**(code **)(*local_80 + 8))();
      }
    }
    ClauseVariantIndex::ResultClauseToVariantClauseFn::~ResultClauseToVariantClauseFn(&local_a8);
    ClauseVariantIndex::ResultClauseToVariantClauseFn::~ResultClauseToVariantClauseFn(&local_f0);
    ClauseVariantIndex::ResultClauseToVariantClauseFn::~ResultClauseToVariantClauseFn(&local_c8);
    if ((_func_int **)local_148._0_8_ == (_func_int **)0x0) {
      return (ClauseIterator)(IteratorCore<Kernel::Clause_*> *)uVar1;
    }
    pp_Var4 = (_func_int **)(local_148._0_8_ + 8);
    *(int *)pp_Var4 = *(int *)pp_Var4 + -1;
    if (*(int *)pp_Var4 != 0) {
      return (ClauseIterator)(IteratorCore<Kernel::Clause_*> *)uVar1;
    }
    (**(code **)(*(_func_int **)local_148._0_8_ + 8))();
    return (ClauseIterator)(IteratorCore<Kernel::Clause_*> *)uVar1;
  }
LAB_002bb050:
  Lib::VirtualIterator<Kernel::Clause_*>::getEmpty();
  return (ClauseIterator)(IteratorCore<Kernel::Clause_*> *)this;
}

Assistant:

ClauseIterator SubstitutionTreeClauseVariantIndex::retrieveVariants(Literal* const * lits, unsigned length)
{
  if(length==0) {
    return pvi( ClauseList::Iterator(_emptyClauses) );
  }
  if(length==1 && lits[0]->ground()) {
    ClauseList* lst;
    if(_groundUnits.find(lits[0], lst)) {
      ASS(lst);
      return pvi( ClauseList::Iterator(lst) );
    }
    else {
      return ClauseIterator::getEmpty();
    }
  }

  LiteralSubstitutionTree* index=_strees[length];
  if(!index) {
    return ClauseIterator::getEmpty();
  }

  Literal* mainLit=getMainLiteral(lits, length);
  return pvi( getFilteredIterator(
    getMappingIterator(
      index->getVariants(mainLit, false, false),
      getCompositionFn(ResultClauseToVariantClauseFn(lits, length),[](auto qr) { return qr.data->clause; })),
    NonzeroFn()) );
}